

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::Copy(aiMesh **_dest,aiMesh *src)

{
  aiFace *paVar1;
  aiMesh *this;
  uint i;
  ulong uVar2;
  long lVar3;
  
  if (src == (aiMesh *)0x0 || _dest == (aiMesh **)0x0) {
    return;
  }
  this = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this);
  *_dest = this;
  memcpy(this,src,0x520);
  GetArrayCopy<aiVector3t<float>>(&this->mVertices,this->mNumVertices);
  GetArrayCopy<aiVector3t<float>>(&this->mNormals,this->mNumVertices);
  GetArrayCopy<aiVector3t<float>>(&this->mTangents,this->mNumVertices);
  GetArrayCopy<aiVector3t<float>>(&this->mBitangents,this->mNumVertices);
  lVar3 = 0;
  while (((lVar3 != 0x40 && (*(long *)((long)this->mTextureCoords + lVar3) != 0)) &&
         (this->mNumVertices != 0))) {
    GetArrayCopy<aiVector3t<float>>
              ((aiVector3t<float> **)((long)this->mTextureCoords + lVar3),this->mNumVertices);
    lVar3 = lVar3 + 8;
  }
  lVar3 = 0;
  while (((lVar3 != 0x40 && (*(long *)((long)this->mColors + lVar3) != 0)) &&
         (this->mNumVertices != 0))) {
    GetArrayCopy<aiColor4t<float>>
              ((aiColor4t<float> **)((long)this->mColors + lVar3),this->mNumVertices);
    lVar3 = lVar3 + 8;
  }
  CopyPtrArray<aiBone>(&this->mBones,this->mBones,this->mNumBones);
  GetArrayCopy<aiFace>(&this->mFaces,this->mNumFaces);
  lVar3 = 8;
  for (uVar2 = 0; uVar2 < this->mNumFaces; uVar2 = uVar2 + 1) {
    paVar1 = this->mFaces;
    GetArrayCopy<unsigned_int>
              ((uint **)((long)&paVar1->mNumIndices + lVar3),*(ai_uint *)((long)paVar1 + lVar3 + -8)
              );
    lVar3 = lVar3 + 0x10;
  }
  CopyPtrArray<aiAnimMesh>(&this->mAnimMeshes,this->mAnimMeshes,this->mNumAnimMeshes);
  return;
}

Assistant:

void SceneCombiner::Copy( aiMesh** _dest, const aiMesh* src ) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiMesh* dest = *_dest = new aiMesh();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiMesh));

    // and reallocate all arrays
    GetArrayCopy( dest->mVertices,   dest->mNumVertices );
    GetArrayCopy( dest->mNormals ,   dest->mNumVertices );
    GetArrayCopy( dest->mTangents,   dest->mNumVertices );
    GetArrayCopy( dest->mBitangents, dest->mNumVertices );

    unsigned int n = 0;
    while (dest->HasTextureCoords(n))
        GetArrayCopy( dest->mTextureCoords[n++],   dest->mNumVertices );

    n = 0;
    while (dest->HasVertexColors(n))
        GetArrayCopy( dest->mColors[n++],   dest->mNumVertices );

    // make a deep copy of all bones
    CopyPtrArray(dest->mBones,dest->mBones,dest->mNumBones);

    // make a deep copy of all faces
    GetArrayCopy(dest->mFaces,dest->mNumFaces);
    for (unsigned int i = 0; i < dest->mNumFaces;++i) {
        aiFace& f = dest->mFaces[i];
        GetArrayCopy(f.mIndices,f.mNumIndices);
    }

    // make a deep copy of all blend shapes
    CopyPtrArray(dest->mAnimMeshes, dest->mAnimMeshes, dest->mNumAnimMeshes);
}